

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

longlong get_big_int(FMFieldPtr field,void *data)

{
  FMFieldPtr in_RSI;
  long *in_RDI;
  longdouble in_ST0;
  longdouble tmp_6;
  unsigned_long_long tmp_5;
  size_t low_bytes_offset;
  long tmp_4;
  size_t tmp_3;
  int tmp_2;
  short tmp_1;
  char tmp;
  long local_38;
  unsigned_long_long local_30;
  unsigned_long_long local_28;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  undefined2 in_stack_ffffffffffffffe4;
  short sVar2;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  unsigned_long_long local_8;
  
  if (*(int *)((long)in_RDI + 0xc) == 1) {
    if ((int)in_RDI[1] == 1) {
      local_8 = (unsigned_long_long)*(char *)((long)&in_RSI->offset + *in_RDI);
    }
    else if ((int)in_RDI[1] == 2) {
      sVar2 = *(short *)((long)&in_RSI->offset + *in_RDI);
      if ((char)in_RDI[2] != '\0') {
        byte_swap(&stack0xffffffffffffffe4,2);
      }
      local_8 = (unsigned_long_long)sVar2;
    }
    else if ((int)in_RDI[1] == 4) {
      iVar1 = *(int *)((long)&in_RSI->offset + *in_RDI);
      if ((char)in_RDI[2] != '\0') {
        byte_swap(&stack0xffffffffffffffe0,4);
      }
      local_8 = (unsigned_long_long)iVar1;
    }
    else if ((int)in_RDI[1] == 8) {
      local_28 = *(unsigned_long_long *)((long)&in_RSI->offset + *in_RDI);
      if ((char)in_RDI[2] != '\0') {
        byte_swap((char *)&local_28,8);
      }
      local_8 = local_28;
    }
    else if ((int)in_RDI[1] == 0x10) {
      local_38 = *in_RDI;
      if ((char)in_RDI[2] != '\0') {
        local_38 = local_38 + 8;
      }
      local_30 = *(unsigned_long_long *)((long)&in_RSI->offset + local_38);
      if ((char)in_RDI[2] != '\0') {
        byte_swap((char *)&local_30,8);
      }
      local_8 = local_30;
    }
    else {
      if (get_long_warn == 0) {
        fprintf(_stderr,"Get Long failed!  Size problems.  File int size is %d.\n",
                (ulong)*(uint *)(in_RDI + 1));
        get_long_warn = get_long_warn + 1;
      }
      local_8 = 0xffffffffffffffff;
    }
  }
  else if (*(int *)((long)in_RDI + 0xc) == 2) {
    local_8 = get_big_unsigned(in_RSI,(void *)CONCAT17(in_stack_ffffffffffffffe7,
                                                       CONCAT16(in_stack_ffffffffffffffe6,
                                                                CONCAT24(in_stack_ffffffffffffffe4,
                                                                         in_stack_ffffffffffffffe0))
                                                      ));
  }
  else {
    if (*(int *)((long)in_RDI + 0xc) != 3) {
      fprintf(_stderr,"Get IOlong failed on invalid data type!\n");
      exit(1);
    }
    get_big_float(stack0x00000018,tmp_6._0_8_);
    local_8 = (unsigned_long_long)in_ST0;
  }
  return local_8;
}

Assistant:

static MAX_INTEGER_TYPE
get_big_int(FMFieldPtr field, void *data)
{
    if (field->data_type == integer_type) {
	if (field->size == sizeof(char)) {
	    char tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(char));
	    return (long) tmp;
	} else if (field->size == sizeof(short)) {
	    short tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(short));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int) sizeof(short));
	    return (long) tmp;
	} else if (field->size == sizeof(int)) {
	    int tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(int));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int) sizeof(int));
	    return (long) tmp;
	} else if (field->size == sizeof(size_t)) {
	    size_t tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(size_t));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(size_t));
	    return tmp;
	} else if (field->size == 2 * sizeof(long)) {
	    long tmp;
	    size_t low_bytes_offset = field->offset;
	    if (WORDS_BIGENDIAN) {
		if (!field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    }
	    memcpy(&tmp, (char *) data + low_bytes_offset, sizeof(long));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(long));
	    return tmp;
	} else {
	    if (!get_long_warn) {
		fprintf(stderr, "Get Long failed!  Size problems.  File int size is %d.\n", field->size);
		get_long_warn++;
	    }
	    return -1;
	}
    } else if (field->data_type == unsigned_type) {
	MAX_UNSIGNED_TYPE tmp = get_big_unsigned(field, data);
	return (MAX_UNSIGNED_TYPE) tmp;
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp = get_big_float(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_INTEGER_TYPE) (long) (double) tmp;
#else
	return (MAX_INTEGER_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get IOlong failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}